

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::JsonUnitTestResultPrinter::EscapeJson
                   (string *__return_storage_ptr__,string *str)

{
  ulong uVar1;
  size_type sVar2;
  byte *pbVar3;
  Message *pMVar4;
  uchar value;
  string local_60;
  char local_2a;
  byte local_29;
  ulong uStack_28;
  char ch;
  size_t i;
  Message m;
  string *str_local;
  
  m.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )str;
  Message::Message((Message *)&i);
  for (uStack_28 = 0; uVar1 = uStack_28,
      sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         m.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl), uVar1 < sVar2; uStack_28 = uStack_28 + 1) {
    pbVar3 = (byte *)std::__cxx11::string::operator[]
                               ((ulong)m.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl);
    local_29 = *pbVar3;
    if (local_29 == 8) {
      Message::operator<<((Message *)&i,(char (*) [3])"\\b");
    }
    else if (local_29 == 9) {
      Message::operator<<((Message *)&i,(char (*) [3])"\\t");
    }
    else if (local_29 == 10) {
      Message::operator<<((Message *)&i,(char (*) [3])"\\n");
    }
    else if (local_29 == 0xc) {
      Message::operator<<((Message *)&i,(char (*) [3])"\\f");
    }
    else if (local_29 == 0xd) {
      Message::operator<<((Message *)&i,(char (*) [3])"\\r");
    }
    else if (((local_29 == 0x22) || (local_29 == 0x2f)) || (local_29 == 0x5c)) {
      local_2a = '\\';
      pMVar4 = Message::operator<<((Message *)&i,&local_2a);
      Message::operator<<(pMVar4,(char *)&local_29);
    }
    else if ((char)local_29 < ' ') {
      pMVar4 = Message::operator<<((Message *)&i,(char (*) [5])"\\u00");
      String::FormatByte_abi_cxx11_(&local_60,(String *)(ulong)local_29,value);
      Message::operator<<(pMVar4,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
    else {
      Message::operator<<((Message *)&i,(char *)&local_29);
    }
  }
  Message::GetString_abi_cxx11_(__return_storage_ptr__,(Message *)&i);
  Message::~Message((Message *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::string JsonUnitTestResultPrinter::EscapeJson(const std::string& str) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '\\':
      case '"':
      case '/':
        m << '\\' << ch;
        break;
      case '\b':
        m << "\\b";
        break;
      case '\t':
        m << "\\t";
        break;
      case '\n':
        m << "\\n";
        break;
      case '\f':
        m << "\\f";
        break;
      case '\r':
        m << "\\r";
        break;
      default:
        if (ch < ' ') {
          m << "\\u00" << String::FormatByte(static_cast<unsigned char>(ch));
        } else {
          m << ch;
        }
        break;
    }
  }

  return m.GetString();
}